

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

char * flatcc_json_parser_build_uint8_vector_base64
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *ref,
                 int urlsafe)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  flatcc_builder_ref_t fVar5;
  char *pcVar6;
  char *buf_00;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  size_t count;
  ulong uVar17;
  bool bVar18;
  byte local_54 [4];
  size_t local_50;
  int local_44;
  byte *local_40;
  byte *local_38;
  
  local_44 = urlsafe;
  pcVar6 = flatcc_json_parser_string_start(ctx,buf,end);
  buf_00 = flatcc_json_parser_string_part(ctx,pcVar6,end);
  if ((buf_00 != end) && (*buf_00 == '\"')) {
    uVar17 = (long)buf_00 - (long)pcVar6;
    uVar3 = (uint)uVar17 & 3;
    local_50 = (uVar17 >> 2) * 3;
    if (uVar3 == 2) {
      local_50 = local_50 + 1;
    }
    else if (uVar3 == 3) {
      local_50 = local_50 + 2;
    }
    iVar4 = flatcc_builder_start_vector(ctx->ctx,1,1,0xffffffff);
    if ((iVar4 == 0) &&
       (pbVar7 = (byte *)flatcc_builder_extend_vector(ctx->ctx,local_50), sVar16 = local_50,
       pbVar7 != (byte *)0x0)) {
      puVar12 = base64_decode_base64url_decode;
      if (local_44 == 0) {
        puVar12 = base64_decode_base64rfc4648_decode;
      }
      uVar11 = -(ulong)(local_50 == 0) | local_50;
      uVar10 = uVar17;
      pcVar13 = pcVar6;
      local_38 = pbVar7;
      while (uVar9 = uVar10, uVar11 != 0) {
        local_40 = pbVar7;
        for (uVar14 = 0; uVar14 < 4; uVar14 = uVar14 + 1) {
          if (uVar9 == uVar14) {
            uVar9 = 0;
            goto LAB_001185b1;
          }
          bVar1 = puVar12[(byte)pcVar13[uVar14]];
          local_54[uVar14] = bVar1;
          if (0x3f < bVar1) {
            if (bVar1 != 0x41) {
              uVar8 = uVar14;
              uVar15 = uVar14;
              if (bVar1 == 0x42) goto LAB_00118582;
              goto LAB_001185a9;
            }
            pcVar13 = pcVar13 + 1;
            uVar9 = uVar9 - 1;
            uVar14 = uVar14 - 1;
          }
        }
        bVar18 = uVar11 < 3;
        uVar11 = uVar11 - 3;
        if (bVar18) goto LAB_00118642;
        *local_40 = local_54[1] >> 4 | local_54[0] << 2;
        local_40[1] = local_54[2] >> 2 | local_54[1] << 4;
        local_40[2] = local_54[2] << 6 | local_54[3];
        pbVar7 = local_40 + 3;
        pcVar13 = pcVar13 + 4;
        uVar10 = uVar9 - 4;
      }
      goto LAB_0011863a;
    }
LAB_0011846b:
    *ref = 0;
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x23;
    goto LAB_00118663;
  }
  goto LAB_00118648;
  while (lVar2 = uVar8 + 1, uVar8 = uVar8 + 1, (byte)(puVar12[(byte)pcVar13[lVar2]] + 0xbf) < 2) {
LAB_00118582:
    uVar15 = uVar8 + 1;
    if ((6 < uVar8) || (uVar9 <= uVar15)) break;
  }
LAB_001185a9:
  uVar9 = uVar9 - uVar15;
  sVar16 = local_50;
LAB_001185b1:
  pbVar7 = local_40;
  if (uVar14 == 0) {
LAB_0011863a:
    uVar10 = uVar9;
    if (uVar9 == 0) {
      count = sVar16 - ((long)pbVar7 - (long)local_38);
      if ((sVar16 < (ulong)((long)pbVar7 - (long)local_38) || count == 0) ||
         (iVar4 = flatcc_builder_truncate_vector(ctx->ctx,count), iVar4 == 0)) {
        fVar5 = flatcc_builder_end_vector(ctx->ctx);
        *ref = fVar5;
        if (fVar5 != 0) {
          pcVar6 = flatcc_json_parser_string_end(ctx,buf_00,end);
          return pcVar6;
        }
      }
      goto LAB_0011846b;
    }
  }
  else if (uVar14 == 3) {
    if (uVar11 != 1 && (local_54[2] & 3) == 0) {
      *local_40 = local_54[1] >> 4 | local_54[0] << 2;
      local_40[1] = local_54[2] >> 2 | local_54[1] << 4;
      pbVar7 = local_40 + 2;
      goto LAB_0011863a;
    }
  }
  else if ((uVar14 == 2) && ((local_54[1] & 0xf) == 0)) {
    *local_40 = local_54[1] >> 4 | local_54[0] << 2;
    pbVar7 = local_40 + 1;
    goto LAB_0011863a;
  }
LAB_00118642:
  buf_00 = pcVar6 + (uVar17 - uVar10);
LAB_00118648:
  *ref = 0;
  if (ctx->error != 0) {
    return end;
  }
  ctx->error = 0x20 - (uint)(local_44 == 0);
LAB_00118663:
  ctx->pos = ((int)buf_00 - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = buf_00;
  return end;
}

Assistant:

const char *flatcc_json_parser_build_uint8_vector_base64(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, flatcc_builder_ref_t *ref, int urlsafe)
{
    const char *mark;
    uint8_t *pval;
    size_t max_len;
    size_t decoded_len, src_len;
    int mode;
    int ret;

    mode = urlsafe ? base64_mode_url : base64_mode_rfc4648;
    buf = flatcc_json_parser_string_start(ctx, buf, end);
    buf = flatcc_json_parser_string_part(ctx, (mark = buf), end);
    if (buf == end || *buf != '\"') {
        goto base64_failed;
    }
    max_len = base64_decoded_size((size_t)(buf - mark));
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) {
        goto failed;
    }
    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, max_len))) {
        goto failed;
    }
    src_len = (size_t)(buf - mark);
    decoded_len = max_len;
    if ((ret = base64_decode(pval, (const uint8_t *)mark, &decoded_len, &src_len, mode))) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (src_len != (size_t)(buf - mark)) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (decoded_len < max_len) {
        if (flatcc_builder_truncate_vector(ctx->ctx, max_len - decoded_len)) {
            goto failed;
        }
    }
    if (!(*ref = flatcc_builder_end_vector(ctx->ctx))) {
        goto failed;
    }
    return flatcc_json_parser_string_end(ctx, buf, end);

failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);

base64_failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end,
            urlsafe ? flatcc_json_parser_error_base64url : flatcc_json_parser_error_base64);
}